

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_sync.hpp
# Opt level: O1

void __thiscall unodb::detail::thread_sync::notify(thread_sync *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->sync_mutex);
  if (iVar1 == 0) {
    this->flag = true;
    pthread_mutex_unlock((pthread_mutex_t *)&this->sync_mutex);
    std::condition_variable::notify_one();
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void notify() {
    {
      const std::lock_guard lock{sync_mutex};
      flag = true;
    }
    sync.notify_one();
  }